

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O2

void __thiscall
dlib::
array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
::resize(array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
         *this,size_t new_size)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  size_t i;
  ulong uVar3;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  temp;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  local_58;
  
  if (this->max_array_size < new_size) {
    local_58.super_enumerable<dlib::thread_pool_implementation::task_state_type>._vptr_enumerable =
         (_func_int **)&PTR__array_001faae8;
    local_58.pool._vptr_memory_manager_stateless_kernel_1 =
         (_func_int **)&PTR__memory_manager_stateless_kernel_1_001fab68;
    local_58.last_pos = (task_state_type *)0x0;
    local_58.array_size = 0;
    local_58.max_array_size = 0;
    local_58.array_elements = (task_state_type *)0x0;
    local_58.pos = (task_state_type *)0x0;
    local_58._at_start = true;
    set_max_size(&local_58,new_size);
    set_size(&local_58,new_size);
    lVar2 = 0;
    uVar3 = 0;
    while( true ) {
      iVar1 = (*(this->super_enumerable<dlib::thread_pool_implementation::task_state_type>).
                _vptr_enumerable[8])(this);
      if (CONCAT44(extraout_var,iVar1) <= uVar3) break;
      std::swap<dlib::thread_pool_implementation::task_state_type>
                ((task_state_type *)(&this->array_elements->is_being_processed + lVar2),
                 (task_state_type *)(&(local_58.array_elements)->is_being_processed + lVar2));
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x1a0;
    }
    swap(&local_58,this);
    ~array(&local_58);
    return;
  }
  set_size(this,new_size);
  return;
}

Assistant:

void array<T,mem_manager>::
    resize (
        size_t new_size
    )
    {
        if (this->max_size() < new_size)
        {
            array temp;
            temp.set_max_size(new_size);
            temp.set_size(new_size);
            for (size_t i = 0; i < this->size(); ++i)
            {
                exchange((*this)[i],temp[i]);
            }
            temp.swap(*this);
        }
        else
        {
            this->set_size(new_size);
        }
    }